

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O1

idx_t duckdb_result_chunk_count(duckdb_result result)

{
  pointer pQVar1;
  MaterializedQueryResult *this;
  ColumnDataCollection *this_00;
  idx_t iVar2;
  
  if ((result.deprecated_error_message != (char *)0x0) &&
     (result.deprecated_error_message[8] != '\x03')) {
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.deprecated_error_message);
    if ((pQVar1->super_BaseQueryResult).type == MATERIALIZED_RESULT) {
      this = (MaterializedQueryResult *)
             duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)result.deprecated_error_message);
      this_00 = duckdb::MaterializedQueryResult::Collection(this);
      iVar2 = duckdb::ColumnDataCollection::ChunkCount(this_00);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

idx_t duckdb_result_chunk_count(duckdb_result result) {
	if (!result.internal_data) {
		return 0;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	if (result_data.result_set_type == duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_DEPRECATED) {
		return 0;
	}
	if (result_data.result->type != duckdb::QueryResultType::MATERIALIZED_RESULT) {
		// Can't know beforehand how many chunks are returned.
		return 0;
	}
	auto &materialized = reinterpret_cast<duckdb::MaterializedQueryResult &>(*result_data.result);
	return materialized.Collection().ChunkCount();
}